

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O3

void enet_host_destroy(ENetHost *host)

{
  void *pvVar1;
  _func_void_void_ptr *p_Var2;
  ENetPeer *__ptr;
  ENetPeer *peer;
  
  if (host == (ENetHost *)0x0) {
    return;
  }
  enet_socket_destroy(host->socket);
  __ptr = host->peers;
  peer = __ptr;
  if (0 < (long)host->peerCount) {
    do {
      enet_peer_reset(peer);
      peer = peer + 1;
      __ptr = host->peers;
    } while (peer < __ptr + host->peerCount);
  }
  pvVar1 = (host->compressor).context;
  if ((pvVar1 != (void *)0x0) &&
     (p_Var2 = (host->compressor).destroy, p_Var2 != (_func_void_void_ptr *)0x0)) {
    (*p_Var2)(pvVar1);
    __ptr = host->peers;
  }
  enet_free(__ptr);
  enet_free(host);
  return;
}

Assistant:

void
enet_host_destroy (ENetHost * host)
{
    ENetPeer * currentPeer;

    if (host == NULL)
      return;

    enet_socket_destroy (host -> socket);

    for (currentPeer = host -> peers;
         currentPeer < & host -> peers [host -> peerCount];
         ++ currentPeer)
    {
       enet_peer_reset (currentPeer);
    }

    if (host -> compressor.context != NULL && host -> compressor.destroy)
      (* host -> compressor.destroy) (host -> compressor.context);

    enet_free (host -> peers);
    enet_free (host);
}